

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_socket(connectdata *conn,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,
                    curl_socket_t *sockfd)

{
  int __type;
  Curl_easy *easy;
  uint uVar1;
  curl_socket_t cVar2;
  int iVar3;
  CURLcode CVar4;
  Curl_sockaddr_ex *pCVar5;
  Curl_sockaddr_ex *pCVar6;
  int __protocol;
  Curl_sockaddr_ex dummy;
  Curl_sockaddr_ex local_c0;
  
  easy = conn->data;
  pCVar5 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar5 = &local_c0;
  }
  iVar3 = ai->ai_family;
  pCVar5->family = iVar3;
  __type = conn->socktype;
  pCVar5->socktype = __type;
  __protocol = 0x11;
  if (__type != 2) {
    __protocol = ai->ai_protocol;
  }
  pCVar6 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar6 = &local_c0;
  }
  pCVar6->protocol = __protocol;
  uVar1 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar1 = ai->ai_addrlen;
  }
  pCVar6->addrlen = uVar1;
  memcpy(&pCVar6->_sa_ex_u,ai->ai_addr,(ulong)uVar1);
  if ((easy->set).fopensocket == (curl_opensocket_callback)0x0) {
    iVar3 = socket(iVar3,__type,__protocol);
    *sockfd = iVar3;
  }
  else {
    Curl_set_in_callback(easy,true);
    cVar2 = (*(easy->set).fopensocket)
                      ((easy->set).opensocket_client,CURLSOCKTYPE_IPCXN,(curl_sockaddr *)pCVar5);
    *sockfd = cVar2;
    Curl_set_in_callback(easy,false);
  }
  if (*sockfd == -1) {
    CVar4 = CURLE_COULDNT_CONNECT;
  }
  else {
    CVar4 = CURLE_OK;
    if ((conn->scope_id != 0) && (CVar4 = CURLE_OK, pCVar5->family == 10)) {
      pCVar5 = &local_c0;
      if (addr != (Curl_sockaddr_ex *)0x0) {
        pCVar5 = addr;
      }
      *(uint *)((long)&pCVar5->_sa_ex_u + 0x18) = conn->scope_id;
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_socket(struct connectdata *conn,
                     const Curl_addrinfo *ai,
                     struct Curl_sockaddr_ex *addr,
                     curl_socket_t *sockfd)
{
  struct Curl_easy *data = conn->data;
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */

  addr->family = ai->ai_family;
  addr->socktype = conn->socktype;
  addr->protocol = conn->socktype == SOCK_DGRAM?IPPROTO_UDP:ai->ai_protocol;
  addr->addrlen = ai->ai_addrlen;

  if(addr->addrlen > sizeof(struct Curl_sockaddr_storage))
     addr->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&addr->sa_addr, ai->ai_addr, addr->addrlen);

  if(data->set.fopensocket) {
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    Curl_set_in_callback(data, true);
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
    Curl_set_in_callback(data, false);
  }
  else
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

#if defined(ENABLE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(conn->scope_id && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->sa_addr;
    sa6->sin6_scope_id = conn->scope_id;
  }
#endif

  return CURLE_OK;

}